

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test_content.h
# Opt level: O2

string * __thiscall data::master::test_filter(string *__return_storage_ptr__,master *this,string *s)

{
  pointer pcVar1;
  size_t i;
  ulong uVar2;
  char cVar3;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  uVar2 = 0;
  do {
    if (__return_storage_ptr__->_M_string_length <= uVar2) {
      return __return_storage_ptr__;
    }
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    cVar3 = pcVar1[uVar2];
    if (cVar3 == 'a') {
      cVar3 = 'b';
LAB_00116491:
      pcVar1[uVar2] = cVar3;
    }
    else if (cVar3 == 'b') {
      cVar3 = 'a';
      goto LAB_00116491;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

std::string test_filter(std::string const &s)
		{
			std::string tmp = s;
			for(size_t i=0;i<tmp.size();i++) {
				switch(tmp[i]) {
				case 'a' : tmp[i]='b'; break;
				case 'b' : tmp[i]='a'; break;
				}
			}
			return tmp;
		}